

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseException.h
# Opt level: O0

void __thiscall AutoArgParse::ParseException::~ParseException(ParseException *this)

{
  ParseException *this_local;
  
  *(undefined ***)this = &PTR__ParseException_001239c8;
  std::__cxx11::string::~string((string *)&this->errorMessage);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

virtual ~ParseException() = default;